

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NtkClauseTop(sat_solver *pSat,Vec_Ptr_t *vNodes,Vec_Int_t *vVars)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  lit Entry;
  Abc_Obj_t *p;
  Abc_Obj_t *pAVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Int_t *vVars_local;
  Vec_Ptr_t *vNodes_local;
  sat_solver *pSat_local;
  
  vVars->nSize = 0;
  for (local_2c = 0; iVar2 = Vec_PtrSize(vNodes), local_2c < iVar2; local_2c = local_2c + 1) {
    p = (Abc_Obj_t *)Vec_PtrEntry(vNodes,local_2c);
    pAVar3 = Abc_ObjRegular(p);
    aVar1 = pAVar3->field_6;
    iVar2 = Abc_ObjIsComplement(p);
    Entry = toLitCond(aVar1.iTemp,iVar2);
    Vec_IntPush(vVars,Entry);
  }
  iVar2 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  return iVar2;
}

Assistant:

int Abc_NtkClauseTop( sat_solver * pSat, Vec_Ptr_t * vNodes, Vec_Int_t * vVars )
{
    Abc_Obj_t * pNode;
    int i;
//printf( "Adding triv %d.         %d\n", Abc_ObjRegular(pNode)->Id, (int)pSat->sat_solver_stats.clauses );
    vVars->nSize = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Vec_IntPush( vVars, toLitCond( (int)(ABC_PTRINT_T)Abc_ObjRegular(pNode)->pCopy, Abc_ObjIsComplement(pNode) ) );
//    Vec_IntPush( vVars, toLitCond( (int)Abc_ObjRegular(pNode)->Id, Abc_ObjIsComplement(pNode) ) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}